

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
RunScriptCore(JsValueRef scriptSource,byte *script,size_t cb,LoadScriptFlag loadScriptFlag,
             JsSourceContext sourceContext,WCHAR *sourceUrl,bool parseOnly,
             JsParseScriptAttributes parseAttributes,bool isSourceModule,JsValueRef *result)

{
  ScriptContext *scriptContext;
  EventLog *this;
  ExecutionInfoManager *this_00;
  code *pcVar1;
  double beginWallTime;
  LoadScriptFlag LVar2;
  JavascriptFunction *pJVar3;
  bool bVar4;
  LoadScriptFlag loadFlag;
  JsrtContext *pJVar5;
  SourceContextInfo *ptr;
  size_t len;
  EventLogEntry *pEVar6;
  ParseableFunctionInfo *pfi;
  FunctionBody *fb;
  TopLevelScriptLoadFunctionBodyResolveInfo *pTVar7;
  undefined4 *puVar8;
  int64 iVar9;
  Var pvVar10;
  Type TVar11;
  Var *args;
  LoadScriptFlag loadFlag_00;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_208 [8];
  ScriptEntryExitRecord __entryExitRecord;
  Arguments local_1c8;
  EnterScriptObject local_1b8;
  Var local_190;
  Var varThis;
  CompileScriptException se;
  undefined1 local_100 [8];
  TTDJsRTFunctionCallActionPopperRecorder callInfoPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_a8 [8];
  EnterScriptObject __enterScriptObject;
  TTDJsRTActionResultAutoRecorder local_78;
  Utf8SourceInfo *local_60;
  Utf8SourceInfo *utf8SourceInfo;
  AutoNestedHandledExceptionType local_4c;
  WCHAR *pWStack_48;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  JavascriptFunction *local_40;
  JavascriptFunction *scriptFunction;
  ScriptContext *__localScriptContext;
  
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  varThis = (Var)0x0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  auStack_a8 = (undefined1  [8])0x0;
  __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)0x0;
  utf8SourceInfo = (Utf8SourceInfo *)sourceContext;
  pWStack_48 = sourceUrl;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
  }
  else {
    scriptFunction =
         (JavascriptFunction *)
         (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&callInfoPopper.m_callAction,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    exitStatus = JsErrorNullArgument;
    if (pWStack_48 != (WCHAR *)0x0 && script != (byte *)0x0) {
      ptr = Js::ScriptContext::GetSourceContextInfo
                      ((ScriptContext *)scriptFunction,(DWORD_PTR)utf8SourceInfo,
                       (SimpleDataCacheWrapper *)0x0);
      if (ptr == (SourceContextInfo *)0x0) {
        len = PAL_wcslen(pWStack_48);
        ptr = Js::ScriptContext::CreateSourceContextInfo
                        ((ScriptContext *)scriptFunction,(DWORD_PTR)utf8SourceInfo,pWStack_48,len,
                         (SimpleDataCacheWrapper *)0x0,(char16 *)0x0,0);
      }
      Memory::WriteBarrierPtr<SourceContextInfo>::WriteBarrierSet
                ((WriteBarrierPtr<SourceContextInfo> *)&se.bstrLine,ptr);
      loadFlag_00 = (parseAttributes & JsParseScriptAttributeLibraryCode) << 7 |
                    (uint)(result != (JsValueRef *)0x0) | loadScriptFlag;
      LVar2 = loadFlag_00 | LoadScriptFlag_Module;
      if (!isSourceModule) {
        LVar2 = loadFlag_00;
      }
      loadFlag = (parseAttributes & JsParseScriptAttributeStrictMode) << 8 | LVar2;
      if (isSourceModule) {
        loadFlag_00 = loadFlag;
      }
      local_60 = (Utf8SourceInfo *)0x0;
      if ((parseAttributes & JsParseScriptAttributeStrictMode) != JsParseScriptAttributeNone) {
        loadFlag_00 = loadFlag;
      }
      if (*(char *)((long)&scriptFunction[0x6b].functionInfo.ptr + 5) == '\x01') {
        pEVar6 = TTD::EventLog::RecordJsRTCodeParse
                           (*(EventLog **)&scriptFunction[0x13].functionInfo.ptr[0xb5].attributes,
                            (TTDJsRTActionResultAutoRecorder *)auStack_a8,loadFlag,
                            SUB41((LVar2 & LoadScriptFlag_Utf8Source) >> 6,0),script,(uint32)cb,
                            (uint64)utf8SourceInfo,pWStack_48);
        loadFlag = loadFlag_00;
      }
      else {
        pEVar6 = (EventLogEntry *)0x0;
      }
      local_40 = Js::ScriptContext::LoadScript
                           ((ScriptContext *)scriptFunction,script,cb,(SRCINFO *)&se.bstrLine,
                            (CompileScriptException *)&varThis,&local_60,L"Global code",loadFlag,
                            scriptSource);
      if (*(char *)((long)&scriptFunction[0x6b].functionInfo.ptr + 5) == '\x01') {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult
                  ((TTDJsRTActionResultAutoRecorder *)auStack_a8,&local_40);
      }
      if ((local_40 != (JavascriptFunction *)0x0) &&
         (*(char *)((long)&scriptFunction[0x6b].functionInfo.ptr + 2) == '\x01')) {
        pfi = Js::JavascriptFunction::GetParseableFunctionInfo(local_40);
        fb = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
        pTVar7 = TTD::EventLog::AddScriptLoad
                           (*(EventLog **)&scriptFunction[0x13].functionInfo.ptr[0xb5].attributes,fb
                            ,0,(uint64)utf8SourceInfo,script,(uint32)cb,loadFlag_00);
        if (pEVar6 != (EventLogEntry *)0x0) {
          TTD::NSLogEvents::JsRTCodeParseAction_SetBodyCtrId
                    (pEVar6,(pTVar7->TopLevelBase).TopLevelBodyCtr);
        }
        __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
        __entryExitRecord.scriptContext = (ScriptContext *)0x0;
        __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
        __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
        __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
        auStack_208 = (undefined1  [8])0x0;
        __entryExitRecord._0_1_ = 0;
        __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
        __entryExitRecord._2_6_ = 0;
        Js::EnterScriptObject::EnterScriptObject
                  (&local_1b8,(ScriptContext *)scriptFunction,(ScriptEntryExitRecord *)auStack_208,
                   unaff_retaddr,&stack0x00000000,true,false,false);
        pJVar3 = scriptFunction;
        Js::ScriptContext::OnScriptStart((ScriptContext *)scriptFunction,false,true);
        Js::EnterScriptObject::VerifyEnterScript(&local_1b8);
        TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                  ((ScriptContextTTD *)pJVar3[0x6b].constructorCache.ptr,fb,(FunctionBody *)0x0);
        TTD::ScriptContextTTD::RegisterLoadedScript
                  ((ScriptContextTTD *)pJVar3[0x6b].constructorCache.ptr,fb,
                   (pTVar7->TopLevelBase).TopLevelBodyCtr);
        Js::EnterScriptObject::~EnterScriptObject(&local_1b8);
      }
      pJVar5 = JsrtContext::GetCurrent();
      JsrtContext::OnScriptLoad(pJVar5,local_40,local_60,(CompileScriptException *)&varThis);
      exitStatus = JsNoError;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)&callInfoPopper.m_callAction);
  }
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_a8,exitStatus);
  if (exitStatus != JsNoError) goto LAB_00373fc2;
  local_78.m_actionEvent = (EventLogEntry *)0x0;
  local_78.m_resultPtr = (TTDVar *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
  }
  else {
    scriptContext =
         (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_4c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    callInfoPopper.m_callAction = (EventLogEntry *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)auStack_a8,scriptContext,
               (ScriptEntryExitRecord *)&callInfoPopper.m_callAction,unaff_retaddr,&stack0x00000000,
               true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)auStack_a8);
    if (local_40 == (JavascriptFunction *)0x0) {
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xe4b,"(false)","Need to implement support here!!!");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar8 = 0;
      }
      exitStatus = JsErrorScriptCompile;
      HandleScriptCompileError(scriptContext,(CompileScriptException *)&varThis,pWStack_48);
    }
    else {
      if (parseOnly) {
        if (result == (JsValueRef *)0x0) {
          exitStatus = JsErrorNullArgument;
          goto LAB_00373fa1;
        }
        *result = local_40;
      }
      else {
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,EvalCompilePhase);
        args = (Var *)0x0;
        TVar11 = (Type)0x0;
        if (bVar4) {
          local_190 = Js::JavascriptOperators::OP_GetThis
                                ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                                 super_JavascriptLibraryBase).undefinedValue.ptr,0,
                                 &scriptContext->super_ScriptContextInfo);
          args = &local_190;
          TVar11 = (Type)0x4000001;
        }
        TTD::TTDJsRTFunctionCallActionPopperRecorder::TTDJsRTFunctionCallActionPopperRecorder
                  ((TTDJsRTFunctionCallActionPopperRecorder *)local_100);
        if (scriptContext->TTDShouldPerformRecordAction == true) {
          pEVar6 = TTD::EventLog::RecordJsRTCallFunction
                             (scriptContext->threadContext->TTDLog,&local_78,
                              scriptContext->threadContext->TTDRootNestingCount,local_40,
                              TVar11._0_4_ & 1,args);
          beginWallTime = TTD::EventLog::GetCurrentWallTime(scriptContext->threadContext->TTDLog);
          TTD::TTDJsRTFunctionCallActionPopperRecorder::InitializeForRecording
                    ((TTDJsRTFunctionCallActionPopperRecorder *)local_100,scriptContext,
                     beginWallTime,pEVar6);
          if (scriptContext->threadContext->TTDRootNestingCount == 0) {
            this = scriptContext->threadContext->TTDLog;
            iVar9 = TTD::EventLog::GetLastEventTime(this);
            TTD::EventLog::ResetCallStackForTopLevelCall(this,iVar9);
            this_00 = scriptContext->threadContext->TTDExecutionInfo;
            if (this_00 != (ExecutionInfoManager *)0x0) {
              iVar9 = TTD::EventLog::GetLastEventTime(this);
              TTD::ExecutionInfoManager::ResetCallStackForTopLevelCall(this_00,iVar9);
            }
          }
        }
        local_1c8.Info = TVar11;
        local_1c8.Values = args;
        pvVar10 = Js::JavascriptFunction::CallRootFunction(local_40,&local_1c8,scriptContext,true);
        if (result != (JsValueRef *)0x0) {
          *result = pvVar10;
        }
        if (scriptContext->TTDShouldPerformRecordAction == true) {
          TTD::TTDJsRTActionResultAutoRecorder::SetResult(&local_78,result);
        }
        TTD::TTDJsRTFunctionCallActionPopperRecorder::~TTDJsRTFunctionCallActionPopperRecorder
                  ((TTDJsRTFunctionCallActionPopperRecorder *)local_100);
      }
      exitStatus = JsNoError;
    }
LAB_00373fa1:
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)auStack_a8);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_4c);
  }
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode(&local_78,exitStatus);
LAB_00373fc2:
  CompileScriptException::~CompileScriptException((CompileScriptException *)&varThis);
  return exitStatus;
}

Assistant:

JsErrorCode RunScriptCore(JsValueRef scriptSource, const byte *script, size_t cb,
    LoadScriptFlag loadScriptFlag, JsSourceContext sourceContext,
    const WCHAR *sourceUrl, bool parseOnly, JsParseScriptAttributes parseAttributes,
    bool isSourceModule, JsValueRef *result)
{
    Js::JavascriptFunction *scriptFunction;
    CompileScriptException se;

    JsErrorCode errorCode = ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PARAM_NOT_NULL(script);
        PARAM_NOT_NULL(sourceUrl);

        SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(sourceContext, nullptr);

        if (sourceContextInfo == nullptr)
        {
            sourceContextInfo = scriptContext->CreateSourceContextInfo(sourceContext, sourceUrl, wcslen(sourceUrl), nullptr);
        }

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ?
            sizeof(utf8char_t) : sizeof(WCHAR);

        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };

        Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
        if (result != nullptr)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_Expression);
        }
        bool isLibraryCode = (parseAttributes & JsParseScriptAttributeLibraryCode) == JsParseScriptAttributeLibraryCode;
        bool isStrictMode = (parseAttributes & JsParseScriptAttributeStrictMode) == JsParseScriptAttributeStrictMode;
        if (isLibraryCode)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_LibraryCode);
        }
        if (isSourceModule)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_Module);
        }
        if (isStrictMode)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_StrictMode);
        }

#if ENABLE_TTD
        TTD::NSLogEvents::EventLogEntry* parseEvent = nullptr;
        if (PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
        {
            parseEvent = scriptContext->GetThreadContext()->TTDLog->RecordJsRTCodeParse(_actionEntryPopper,
                loadScriptFlag, ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source),
                script, (uint32)cb, sourceContext, sourceUrl);
        }
#endif

        scriptFunction = scriptContext->LoadScript(script, cb,
            &si, &se, &utf8SourceInfo,
            Js::Constants::GlobalCode, loadScriptFlag, scriptSource);

#if ENABLE_TTD
        if(PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
        {
            _actionEntryPopper.SetResult((Js::Var*)&scriptFunction);
        }

        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if (scriptFunction != nullptr && scriptContext->IsTTDRecordModeEnabled())
        {
            //Make sure we have the body and text information available
            Js::FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(scriptFunction->GetParseableFunctionInfo());

            const TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddScriptLoad(globalBody, kmodGlobal, sourceContext, script, (uint32)cb, loadScriptFlag);
            if(parseEvent != nullptr)
            {
                TTD::NSLogEvents::JsRTCodeParseAction_SetBodyCtrId(parseEvent, tbfi->TopLevelBase.TopLevelBodyCtr);
            }

            //walk global body to (1) add functions to pin set (2) build parent map
            BEGIN_JS_RUNTIME_CALL(scriptContext);
            {
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterLoadedScript(globalBody, tbfi->TopLevelBase.TopLevelBodyCtr);
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
#endif

        JsrtContext * context = JsrtContext::GetCurrent();
        context->OnScriptLoad(scriptFunction, utf8SourceInfo, &se);

        return JsNoError;
    });

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    return ContextAPIWrapper<false>([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        if (scriptFunction == nullptr)
        {
            PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

            HandleScriptCompileError(scriptContext, &se, sourceUrl);
            return JsErrorScriptCompile;
        }

        if (parseOnly)
        {
            PARAM_NOT_NULL(result);
            *result = scriptFunction;
        }
        else
        {
            Js::Arguments args(0, nullptr);
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            Js::Var varThis;
            if (PHASE_FORCE1(Js::EvalCompilePhase))
            {
                varThis = Js::JavascriptOperators::OP_GetThis(scriptContext->GetLibrary()->GetUndefined(), kmodGlobal, scriptContext);
                args.Info.Flags = (Js::CallFlags)Js::CallFlags::CallFlags_Eval;
                args.Info.Count = 1;
                args.Values = &varThis;
            }
#endif

#if ENABLE_TTD
            TTD::TTDJsRTFunctionCallActionPopperRecorder callInfoPopper;
            if(PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
            {
                TTD::NSLogEvents::EventLogEntry* callEvent = scriptContext->GetThreadContext()->TTDLog->RecordJsRTCallFunction(_actionEntryPopper, scriptContext->GetThreadContext()->TTDRootNestingCount, scriptFunction, args.Info.Count, args.Values);
                callInfoPopper.InitializeForRecording(scriptContext, scriptContext->GetThreadContext()->TTDLog->GetCurrentWallTime(), callEvent);

                if(scriptContext->GetThreadContext()->TTDRootNestingCount == 0)
                {
                    TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;
                    elog->ResetCallStackForTopLevelCall(elog->GetLastEventTime());

                    TTD::ExecutionInfoManager* emanager = scriptContext->GetThreadContext()->TTDExecutionInfo;
                    if(emanager != nullptr)
                    {
                        emanager->ResetCallStackForTopLevelCall(elog->GetLastEventTime());
                    }
                }
            }
#endif

            Js::Var varResult = scriptFunction->CallRootFunction(args, scriptContext, true);
            if (result != nullptr)
            {
                *result = varResult;
            }

#if ENABLE_TTD
            if(PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
            {
                _actionEntryPopper.SetResult(result);
            }
#endif
        }
        return JsNoError;
    });
}